

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

bool Dominates(VmInstruction *a,VmInstruction *b)

{
  bool bVar1;
  VmInstruction *b_local;
  VmInstruction *a_local;
  
  if (a->parent == b->parent) {
    bVar1 = IsAfter(b,a);
    if (bVar1) {
      a_local._7_1_ = true;
    }
    else {
      a_local._7_1_ = false;
    }
  }
  else {
    a_local._7_1_ = Dominates(a->parent,b->parent);
  }
  return a_local._7_1_;
}

Assistant:

bool Dominates(VmInstruction *a, VmInstruction *b)
{
	// If instructions come from different blocks, check if blocks dominate each other
	if(a->parent != b->parent)
		return Dominates(a->parent, b->parent);

	// a dominates b is b is defined after a in the same block
	if(IsAfter(b, a))
		return true;

	return false;
}